

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimes.cxx
# Opt level: O2

bool __thiscall cmFileTimes::Store(cmFileTimes *this,string *fileName)

{
  _Head_base<0UL,_cmFileTimes::Times_*,_false> __file_times;
  int iVar1;
  
  __file_times._M_head_impl =
       (this->times)._M_t.
       super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t.
       super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
       super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl;
  if ((utimbuf *)__file_times._M_head_impl != (utimbuf *)0x0) {
    iVar1 = utime((fileName->_M_dataplus)._M_p,(utimbuf *)__file_times._M_head_impl);
    return -1 < iVar1;
  }
  return false;
}

Assistant:

bool cmFileTimes::Store(std::string const& fileName) const
{
  if (!IsValid()) {
    return false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  cmFileTimes::WindowsHandle handle = CreateFileW(
    cmSystemTools::ConvertToWindowsExtendedPath(fileName).c_str(),
    FILE_WRITE_ATTRIBUTES, 0, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!handle) {
    return false;
  }
  return SetFileTime(handle, &this->times->timeCreation,
                     &this->times->timeLastAccess,
                     &this->times->timeLastWrite) != 0;
#else
  return utime(fileName.c_str(), &this->times->timeBuf) >= 0;
#endif
}